

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (argc < 2) {
    printf("Usage : %s [options] XMLfiles ...\n",*argv);
    puts("\tParse the XML files using the xmlTextReader API");
    puts("\t --count: count the number of attribute and elements");
    puts("\t --valid: validate the document");
    puts("\t --consumed: count the number of bytes consumed");
    exit(1);
  }
  xmlCheckVersion(0x33072);
  local_40 = noent;
  local_3c = valid;
  local_38 = consumed;
  local_34 = count;
  uVar6 = 1;
  iVar3 = dump;
  iVar7 = debug;
  do {
    pcVar1 = argv[uVar6];
    iVar2 = strcmp(pcVar1,"-debug");
    if (iVar2 == 0) {
LAB_001013af:
      iVar7 = iVar7 + 1;
      debug = iVar7;
    }
    else {
      iVar2 = strcmp(pcVar1,"--debug");
      if (iVar2 == 0) goto LAB_001013af;
      iVar2 = strcmp(pcVar1,"-dump");
      if (iVar2 == 0) {
LAB_001013bb:
        iVar3 = iVar3 + 1;
        dump = iVar3;
      }
      else {
        iVar2 = strcmp(pcVar1,"--dump");
        if (iVar2 == 0) goto LAB_001013bb;
        iVar2 = strcmp(pcVar1,"-count");
        if (iVar2 == 0) {
LAB_001013c7:
          count = local_34 + 1;
          local_34 = count;
        }
        else {
          iVar2 = strcmp(pcVar1,"--count");
          if (iVar2 == 0) goto LAB_001013c7;
          iVar2 = strcmp(pcVar1,"-consumed");
          if (iVar2 == 0) {
LAB_001013d9:
            consumed = local_38 + 1;
            local_38 = consumed;
          }
          else {
            iVar2 = strcmp(pcVar1,"--consumed");
            if (iVar2 == 0) goto LAB_001013d9;
            iVar2 = strcmp(pcVar1,"-valid");
            if (iVar2 == 0) {
LAB_001013eb:
              valid = local_3c + 1;
              local_3c = valid;
            }
            else {
              iVar2 = strcmp(pcVar1,"--valid");
              if (iVar2 == 0) goto LAB_001013eb;
              iVar2 = strcmp(pcVar1,"-noent");
              if (iVar2 == 0) {
LAB_0010139d:
                noent = local_40 + 1;
                local_40 = noent;
              }
              else {
                iVar2 = strcmp(pcVar1,"--noent");
                if (iVar2 == 0) goto LAB_0010139d;
              }
            }
          }
        }
      }
    }
    uVar6 = uVar6 + 1;
    if ((uint)argc == uVar6) {
      if (local_40 != 0) {
        xmlSubstituteEntitiesDefault(1);
      }
      uVar6 = 1;
      do {
        pcVar1 = argv[uVar6];
        if (*pcVar1 != '-') {
          if (count != 0) {
            elem = 0;
            attrs = 0;
          }
          lVar4 = xmlNewTextReaderFilename(pcVar1);
          if (lVar4 == 0) {
            fprintf(_stderr,"Unable to open %s\n",pcVar1);
          }
          else {
            if (valid != 0) {
              xmlTextReaderSetParserProp(lVar4,3,1);
            }
            while( true ) {
              iVar3 = xmlTextReaderRead(lVar4);
              if (iVar3 != 1) break;
              iVar3 = xmlTextReaderNodeType(lVar4);
              if ((count != 0) && (iVar3 == 1)) {
                elem = elem + 1;
                iVar3 = xmlTextReaderAttributeCount(lVar4);
                attrs = attrs + iVar3;
              }
            }
            if (consumed != 0) {
              uVar5 = xmlTextReaderByteConsumed(lVar4);
              printf("%ld bytes consumed by parser\n",uVar5);
            }
            xmlFreeTextReader(lVar4);
            if (iVar3 == 0) {
              if (count != 0) {
                printf("%s : %d elements, %d attributes\n",pcVar1,(ulong)(uint)elem,
                       (ulong)(uint)attrs);
              }
            }
            else {
              printf("%s : failed to parse\n",pcVar1);
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)argc);
      xmlCleanupParser();
      xmlMemoryDump();
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int files = 0;

    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }
    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if ((!strcmp(argv[i], "-debug")) || (!strcmp(argv[i], "--debug")))
	    debug++;
	else if ((!strcmp(argv[i], "-dump")) || (!strcmp(argv[i], "--dump")))
	    dump++;
	else if ((!strcmp(argv[i], "-count")) || (!strcmp(argv[i], "--count")))
	    count++;
	else if ((!strcmp(argv[i], "-consumed")) || (!strcmp(argv[i], "--consumed")))
	    consumed++;
	else if ((!strcmp(argv[i], "-valid")) || (!strcmp(argv[i], "--valid")))
	    valid++;
	else if ((!strcmp(argv[i], "-noent")) ||
	         (!strcmp(argv[i], "--noent")))
	    noent++;
    }
    if (noent != 0) xmlSubstituteEntitiesDefault(1);
    for (i = 1; i < argc ; i++) {
	if (argv[i][0] != '-') {
	    handleFile(argv[i]);
	    files ++;
	}
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(0);
}